

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cpp
# Opt level: O2

void cppcms::impl::setup_logging(value *settings)

{
  _Alloc_hider _Var1;
  bool bVar2;
  level_type lVar3;
  int iVar4;
  value *pvVar5;
  shared_ptr *psVar6;
  standard_error *this;
  syslog *psVar7;
  long lVar8;
  file *this_00;
  cppcms_error *this_01;
  uint uVar9;
  uint uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  uint uVar11;
  string facility;
  string log_file;
  string sfacility;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  value *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vops;
  string local_50 [32];
  
  json::value::get_abi_cxx11_(&log_file,settings,"logging.level","error");
  booster::log::logger::string_to_level((string *)&log_file);
  std::__cxx11::string::~string((string *)&log_file);
  lVar3 = booster::log::logger::instance();
  booster::log::logger::set_default_level(lVar3);
  pvVar5 = json::value::find(settings,"logging.file");
  bVar2 = json::value::is_undefined(pvVar5);
  if (bVar2) {
    pvVar5 = json::value::find(settings,"logging.syslog");
    bVar2 = json::value::is_undefined(pvVar5);
    if (!bVar2) goto LAB_001f2a16;
    pvVar5 = json::value::find(settings,"logging.stderr");
    bVar2 = json::value::is_undefined(pvVar5);
    if (!bVar2) goto LAB_001f2a16;
  }
  else {
LAB_001f2a16:
    log_file._M_dataplus._M_p = log_file._M_dataplus._M_p & 0xffffffffffffff00;
    bVar2 = json::value::get<bool>(settings,"logging.stderr",(bool *)&log_file);
    if (!bVar2) goto LAB_001f2a71;
  }
  psVar6 = (shared_ptr *)booster::log::logger::instance();
  this = (standard_error *)operator_new(0x10);
  booster::log::sinks::standard_error::standard_error(this);
  std::__shared_ptr<booster::log::sink,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<booster::log::sinks::standard_error,void>
            ((__shared_ptr<booster::log::sink,(__gnu_cxx::_Lock_policy)2> *)&log_file,this);
  booster::log::logger::add_sink(psVar6);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&log_file._M_string_length);
LAB_001f2a71:
  log_file._M_dataplus._M_p = log_file._M_dataplus._M_p & 0xffffffffffffff00;
  bVar2 = json::value::get<bool>(settings,"logging.syslog.enable",(bool *)&log_file);
  if (bVar2) {
    json::value::get_abi_cxx11_(&log_file,settings,"logging.syslog.id","");
    json::value::get_abi_cxx11_(&facility,settings,"logging.syslog.facility","user");
    sfacility._M_dataplus._M_p = (pointer)0x0;
    sfacility._M_string_length = 0;
    sfacility.field_2._M_allocated_capacity = 0;
    json::value::get<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&vops,settings,"logging.syslog.options",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&sfacility);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&sfacility);
    json::value::get_abi_cxx11_(&sfacility,settings,"logging.syslog.options","");
    uVar10 = 0;
    uVar11 = 0;
    local_70 = settings;
    while( true ) {
      if ((ulong)((long)vops.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)vops.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar11) break;
      __lhs = vops.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar11;
      bVar2 = std::operator==(__lhs,"LOG_CONS");
      uVar9 = 2;
      if (!bVar2) {
        bVar2 = std::operator==(__lhs,"LOG_NDELAY");
        uVar9 = 8;
        if (!bVar2) {
          bVar2 = std::operator==(__lhs,"LOG_NOWAIT");
          uVar9 = 0x10;
          if (!bVar2) {
            bVar2 = std::operator==(__lhs,"LOG_ODELAY");
            uVar9 = 4;
            if (!bVar2) {
              bVar2 = std::operator==(__lhs,"LOG_PERROR");
              uVar9 = 0x20;
              if (!bVar2) {
                bVar2 = std::operator==(__lhs,"LOG_PID");
                uVar9 = (uint)bVar2;
              }
            }
          }
        }
      }
      uVar10 = uVar10 | uVar9;
      uVar11 = uVar11 + 1;
    }
    if (facility._M_string_length == 0) {
      iVar4 = 0;
      settings = local_70;
    }
    else {
      bVar2 = std::operator==(&facility,"user");
      settings = local_70;
      if (bVar2) {
        iVar4 = 8;
      }
      else {
        bVar2 = std::operator==(&facility,"local0");
        iVar4 = 0x80;
        if (!bVar2) {
          bVar2 = std::operator==(&facility,"local1");
          iVar4 = 0x88;
          if (!bVar2) {
            bVar2 = std::operator==(&facility,"local2");
            iVar4 = 0x90;
            if (!bVar2) {
              bVar2 = std::operator==(&facility,"local3");
              iVar4 = 0x98;
              if (!bVar2) {
                bVar2 = std::operator==(&facility,"local4");
                iVar4 = 0xa0;
                if (!bVar2) {
                  bVar2 = std::operator==(&facility,"local5");
                  iVar4 = 0xa8;
                  if (!bVar2) {
                    bVar2 = std::operator==(&facility,"local6");
                    iVar4 = 0xb0;
                    if (!bVar2) {
                      bVar2 = std::operator==(&facility,"local7");
                      iVar4 = 0xb8;
                      if (!bVar2) {
                        this_01 = (cppcms_error *)__cxa_allocate_exception(0x30);
                        std::operator+(&local_90,"Unsupported syslog facility: ",&facility);
                        cppcms_error::cppcms_error(this_01,&local_90);
                        __cxa_throw(this_01,&cppcms_error::typeinfo,
                                    booster::runtime_error::~runtime_error);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (log_file._M_string_length == 0) {
      psVar6 = (shared_ptr *)booster::log::logger::instance();
      psVar7 = (syslog *)operator_new(0x10);
      booster::log::sinks::syslog::syslog(psVar7,uVar10,iVar4);
      std::__shared_ptr<booster::log::sink,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<booster::log::sinks::syslog,void>
                ((__shared_ptr<booster::log::sink,(__gnu_cxx::_Lock_policy)2> *)&local_90,psVar7);
      booster::log::logger::add_sink(psVar6);
    }
    else {
      psVar6 = (shared_ptr *)booster::log::logger::instance();
      psVar7 = (syslog *)operator_new(0x10);
      booster::log::sinks::syslog::syslog(psVar7,(string *)&log_file,uVar10,iVar4);
      std::__shared_ptr<booster::log::sink,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<booster::log::sinks::syslog,void>
                ((__shared_ptr<booster::log::sink,(__gnu_cxx::_Lock_policy)2> *)&local_90,psVar7);
      booster::log::logger::add_sink(psVar6);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90._M_string_length);
    std::__cxx11::string::~string((string *)&sfacility);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vops);
    std::__cxx11::string::~string((string *)&facility);
    std::__cxx11::string::~string((string *)&log_file);
  }
  log_file._M_dataplus._M_p = (pointer)&log_file.field_2;
  log_file._M_string_length = 0;
  log_file.field_2._M_local_buf[0] = '\0';
  json::value::get_abi_cxx11_(&facility,settings,"logging.file.name","");
  lVar8 = std::__cxx11::string::operator=((string *)&log_file,(string *)&facility);
  lVar8 = *(long *)(lVar8 + 8);
  std::__cxx11::string::~string((string *)&facility);
  if (lVar8 != 0) {
    this_00 = (file *)operator_new(0x30);
    booster::log::sinks::file::file(this_00);
    std::__shared_ptr<booster::log::sinks::file,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<booster::log::sinks::file,void>
              ((__shared_ptr<booster::log::sinks::file,(__gnu_cxx::_Lock_policy)2> *)&sfacility,
               this_00);
    facility._M_dataplus._M_p._0_4_ = 0;
    iVar4 = json::value::get<int>(settings,"logging.file.max_files",(int *)&facility);
    if (0 < iVar4) {
      booster::log::sinks::file::max_files((uint)sfacility._M_dataplus._M_p);
    }
    facility._M_dataplus._M_p._0_4_ = (uint)facility._M_dataplus._M_p & 0xffffff00;
    bVar2 = json::value::get<bool>(settings,"logging.file.append",(bool *)&facility);
    if (bVar2) {
      booster::log::sinks::file::append();
    }
    _Var1._M_p = sfacility._M_dataplus._M_p;
    std::__cxx11::string::string(local_50,(string *)&log_file);
    booster::log::sinks::file::open(_Var1._M_p,local_50);
    std::__cxx11::string::~string(local_50);
    json::value::get_abi_cxx11_(&facility,settings,"logging.file.timezone","");
    booster::log::sinks::file::set_timezone((string *)sfacility._M_dataplus._M_p);
    psVar6 = (shared_ptr *)booster::log::logger::instance();
    std::__shared_ptr<booster::log::sink,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<booster::log::sinks::file,void>
              ((__shared_ptr<booster::log::sink,(__gnu_cxx::_Lock_policy)2> *)&local_90,
               (__shared_ptr<booster::log::sinks::file,_(__gnu_cxx::_Lock_policy)2> *)&sfacility);
    booster::log::logger::add_sink(psVar6);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90._M_string_length);
    std::__cxx11::string::~string((string *)&facility);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sfacility._M_string_length);
  }
  std::__cxx11::string::~string((string *)&log_file);
  return;
}

Assistant:

void impl::setup_logging(json::value const &settings)
{
	using namespace booster::log;
	level_type level = logger::string_to_level(settings.get("logging.level","error"));
	logger::instance().set_default_level(level);
	if(	(
			settings.find("logging.file").is_undefined()
			&& settings.find("logging.syslog").is_undefined()
			&& settings.find("logging.stderr").is_undefined()
		)
		|| 
		settings.get("logging.stderr",false)==true
	  )
	{
		logger::instance().add_sink(booster::shared_ptr<sink>(new sinks::standard_error()));
	}
	if(settings.get("logging.syslog.enable",false)==true) {
		#ifndef CPPCMS_POSIX
			throw cppcms_error("Syslog is not availible on Windows");
		#else
		std::string id = settings.get("logging.syslog.id","");
		std::string facility = settings.get("logging.syslog.facility","user");
		std::vector<std::string> vops = settings.get("logging.syslog.options",std::vector<std::string>());
		std::string sfacility = settings.get("logging.syslog.options","");
		int facility_code = 0;
		int ops = 0;
		for(unsigned i=0;i<vops.size();i++) {
			std::string const &op=vops[i];
			if(op=="LOG_CONS") ops|=LOG_CONS;
			else if(op=="LOG_NDELAY") ops|=LOG_NDELAY;
			else if(op=="LOG_NOWAIT") ops|=LOG_NOWAIT;
			else if(op=="LOG_ODELAY") ops|=LOG_ODELAY;
			#ifdef LOG_PERROR
			else if(op=="LOG_PERROR") ops|=LOG_PERROR;
			#endif
			else if(op=="LOG_PID") ops|=LOG_PID;
		}
		if(!facility.empty()) {
			if(facility == "user") {
				facility_code = LOG_USER;
			} else if(facility == "local0") {
				facility_code = LOG_LOCAL0;
			} else if(facility == "local1") {
				facility_code = LOG_LOCAL1;
			} else if(facility == "local2") {
				facility_code = LOG_LOCAL2;
			} else if(facility == "local3") {
				facility_code = LOG_LOCAL3;
			} else if(facility == "local4") {
				facility_code = LOG_LOCAL4;
			} else if(facility == "local5") {
				facility_code = LOG_LOCAL5;
			} else if(facility == "local6") {
				facility_code = LOG_LOCAL6;
			} else if(facility == "local7") {
				facility_code = LOG_LOCAL7;
			} else {
				throw cppcms_error("Unsupported syslog facility: " + facility);
			}
		}
		if(id.empty())
			logger::instance().add_sink(booster::shared_ptr<sink>(new sinks::syslog(ops,facility_code)));
		else
			logger::instance().add_sink(booster::shared_ptr<sink>(new sinks::syslog(id,ops,facility_code)));
		#endif
	}

	std::string log_file;
	if(!(log_file=settings.get("logging.file.name","")).empty()) {
		booster::shared_ptr<sinks::file> file(new sinks::file());
		int max_files=0;
		if((max_files = settings.get("logging.file.max_files",0)) > 0)
			file->max_files(max_files);
		bool append = false;
		if((append = settings.get("logging.file.append",false))==true)
			file->append();
		file->open(log_file);
		std::string tz = settings.get("logging.file.timezone","");
		file->set_timezone(tz);
		logger::instance().add_sink(file);
	}
}